

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * cmsys::regpiece(int *flagp)

{
  int *piVar1;
  char *pcVar2;
  char *val;
  undefined4 uVar3;
  uint local_34;
  char *pcStack_30;
  int flags;
  char *next;
  int *piStack_20;
  char op;
  char *ret;
  int *flagp_local;
  
  ret = (char *)flagp;
  piStack_20 = (int *)regatom((int *)&local_34);
  if (piStack_20 == (int *)0x0) {
    flagp_local = (int *)0x0;
  }
  else {
    next._7_1_ = *regparse;
    if (((next._7_1_ == '*') || (next._7_1_ == '+')) || (next._7_1_ == '?')) {
      if (((local_34 & 1) == 0) && (next._7_1_ != '?')) {
        printf("RegularExpression::compile() : *+ operand could be empty.\n");
        flagp_local = (int *)0x0;
      }
      else {
        uVar3 = 1;
        if (next._7_1_ != '+') {
          uVar3 = 4;
        }
        *(undefined4 *)ret = uVar3;
        if ((next._7_1_ == '*') && ((local_34 & 2) != 0)) {
          reginsert('\n',(char *)piStack_20);
        }
        else if (next._7_1_ == '*') {
          reginsert('\x06',(char *)piStack_20);
          piVar1 = piStack_20;
          pcVar2 = regnode('\a');
          regoptail((char *)piVar1,pcVar2);
          regoptail((char *)piStack_20,(char *)piStack_20);
          piVar1 = piStack_20;
          pcVar2 = regnode('\x06');
          regtail((char *)piVar1,pcVar2);
          piVar1 = piStack_20;
          pcVar2 = regnode('\t');
          regtail((char *)piVar1,pcVar2);
        }
        else if ((next._7_1_ == '+') && ((local_34 & 2) != 0)) {
          reginsert('\v',(char *)piStack_20);
        }
        else if (next._7_1_ == '+') {
          pcStack_30 = regnode('\x06');
          regtail((char *)piStack_20,pcStack_30);
          pcVar2 = regnode('\a');
          regtail(pcVar2,(char *)piStack_20);
          pcVar2 = pcStack_30;
          val = regnode('\x06');
          regtail(pcVar2,val);
          piVar1 = piStack_20;
          pcVar2 = regnode('\t');
          regtail((char *)piVar1,pcVar2);
        }
        else if (next._7_1_ == '?') {
          reginsert('\x06',(char *)piStack_20);
          piVar1 = piStack_20;
          pcVar2 = regnode('\x06');
          regtail((char *)piVar1,pcVar2);
          pcStack_30 = regnode('\t');
          regtail((char *)piStack_20,pcStack_30);
          regoptail((char *)piStack_20,pcStack_30);
        }
        regparse = regparse + 1;
        if (((*regparse == '*') || (*regparse == '+')) || (*regparse == '?')) {
          printf("RegularExpression::compile(): Nested *?+.\n");
          flagp_local = (int *)0x0;
        }
        else {
          flagp_local = piStack_20;
        }
      }
    }
    else {
      *(uint *)ret = local_34;
      flagp_local = piStack_20;
    }
  }
  return (char *)flagp_local;
}

Assistant:

static char* regpiece (int *flagp) {
    char* ret;
    char  op;
    char* next;
    int   flags;

    ret = regatom(&flags);
    if (ret == 0)
        return (0);

    op = *regparse;
    if (!ISMULT(op)) {
        *flagp = flags;
        return (ret);
    }

    if (!(flags & HASWIDTH) && op != '?') {
        //RAISE Error, SYM(RegularExpression), SYM(Empty_Operand),
        printf ("RegularExpression::compile() : *+ operand could be empty.\n");
        return 0;
    }
    *flagp = (op != '+') ? (WORST | SPSTART) : (WORST | HASWIDTH);

    if (op == '*' && (flags & SIMPLE))
        reginsert(STAR, ret);
    else if (op == '*') {
        // Emit x* as (x&|), where & means "self".
        reginsert(BRANCH, ret); // Either x
        regoptail(ret, regnode(BACK));  // and loop
        regoptail(ret, ret);    // back
        regtail(ret, regnode(BRANCH));  // or
        regtail(ret, regnode(NOTHING)); // null.
    }
    else if (op == '+' && (flags & SIMPLE))
        reginsert(PLUS, ret);
    else if (op == '+') {
        // Emit x+ as x(&|), where & means "self".
        next = regnode(BRANCH); // Either
        regtail(ret, next);
        regtail(regnode(BACK), ret);    // loop back
        regtail(next, regnode(BRANCH)); // or
        regtail(ret, regnode(NOTHING)); // null.
    }
    else if (op == '?') {
        // Emit x? as (x|)
        reginsert(BRANCH, ret); // Either x
        regtail(ret, regnode(BRANCH));  // or
        next = regnode(NOTHING);// null.
        regtail(ret, next);
        regoptail(ret, next);
    }
    regparse++;
    if (ISMULT(*regparse)) {
        //RAISE Error, SYM(RegularExpression), SYM(Nested_Operand),
        printf ("RegularExpression::compile(): Nested *?+.\n");
        return 0;
    }
    return (ret);
}